

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_false>_>_>
::_build_from_H(Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_false>_>_>
                *this,ID_index cellID,Tmp_column *column,
               vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               *chainsInH)

{
  Element e2;
  uint uVar1;
  Column_settings *this_00;
  uint uVar2;
  mapped_type *pmVar3;
  iterator __position;
  node_ptr plVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool> pVar5;
  pair<unsigned_int,_unsigned_int> *idx_h;
  key_type local_5c;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_false>_>_>
  *local_58;
  pointer local_50;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_48;
  pointer local_40;
  ID_index local_34;
  
  local_5c = 1;
  local_58 = this;
  local_34 = cellID;
  std::
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
  ::_M_emplace_unique<unsigned_int&,int>
            ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
              *)column,&local_34,(int *)&local_5c);
  local_50 = (chainsInH->
             super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  local_40 = (chainsInH->
             super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (local_50 != local_40) {
    local_48 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&local_58->matrix_;
    do {
      local_5c = local_50->first;
      pmVar3 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at(local_48,&local_5c);
      plVar4 = (pmVar3->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
      if (plVar4 != (node_ptr)&pmVar3->column_) {
        e2 = local_50->second;
        this_00 = local_58->colSettings_;
        do {
          local_5c = *(key_type *)&plVar4[1].next_;
          pVar5 = std::
                  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                  ::_M_emplace_unique<unsigned_int,unsigned_int_const&>
                            ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                              *)column,&local_5c,
                             (uint *)((long)(plVar4 + 0xffffffffffffffff) + 0xcU));
          __position._M_node = (_Base_ptr)pVar5.first._M_node;
          if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            uVar2 = *(uint *)((long)(plVar4 + 0xffffffffffffffff) + 0xcU) * e2 +
                    *(int *)&__position._M_node[1].field_0x4;
            uVar1 = (this_00->operators).characteristic_;
            if (uVar1 <= uVar2) {
              uVar2 = uVar2 % uVar1;
            }
            *(uint *)&__position._M_node[1].field_0x4 = uVar2;
            if (uVar2 == 0) {
              std::
              _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
              ::erase_abi_cxx11_((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                                  *)column,__position);
            }
          }
          else {
            persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply_inplace
                      (&this_00->operators,(Element *)&__position._M_node[1].field_0x4,e2);
          }
          plVar4 = plVar4->next_;
        } while (plVar4 != (node_ptr)&pmVar3->column_);
      }
      local_50 = local_50 + 1;
    } while (local_50 != local_40);
  }
  return;
}

Assistant:

inline void Chain_matrix<Master_matrix>::_build_from_H(ID_index cellID,
                                                       Tmp_column& column,
                                                       std::vector<Entry_representative>& chainsInH)
{
  if constexpr (Master_matrix::Option_list::is_z2) {
    column.insert(cellID);
    for (Index idx_h : chainsInH) {
      _add_to(get_column(idx_h), column, 1u);
    }
  } else {
    column.emplace(cellID, 1);
    for (std::pair<Index, Field_element>& idx_h : chainsInH) {
      _add_to(get_column(idx_h.first), column, idx_h.second);
    }
  }
}